

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLStateMachine.cpp
# Opt level: O3

int __thiscall SQLStateMachine::update_state(SQLStateMachine *this,string *token)

{
  int iVar1;
  bool bVar2;
  Keyword *pKVar3;
  ulong uVar4;
  string _token;
  string local_38;
  
  string_util::uppercase(&local_38,token);
  bVar2 = Map::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
          ::contains(&this->keywords,&local_38);
  uVar4 = 4;
  if (bVar2) {
    pKVar3 = Map::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
             ::operator[](&this->keywords,&local_38);
    uVar4 = (ulong)*pKVar3;
  }
  iVar1 = this->state_table[this->last_state][uVar4];
  this->last_state = iVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return iVar1;
}

Assistant:

int SQLStateMachine::update_state(const std::string& token) {
    sql_parser::Keyword type = sql_parser::STRING;
    // uppercase the token
    std::string _token = string_util::uppercase(token);
    if (keywords.contains(_token)) {
        type = keywords[_token];
    }
    last_state = state_table[last_state][type];
    return last_state;
}